

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.c
# Opt level: O1

void http_parser_init(http_parser *parser,http_parser_type t)

{
  void *pvVar1;
  http_parser_type hVar2;
  
  pvVar1 = parser->data;
  parser->http_major = 0;
  parser->http_minor = 0;
  *(undefined4 *)&parser->field_0x14 = 0;
  parser->data = (void *)0x0;
  *(undefined8 *)parser = 0;
  parser->content_length = 0;
  parser->data = pvVar1;
  hVar2 = 0x1200;
  if (t != HTTP_REQUEST) {
    hVar2 = (uint)(t == HTTP_RESPONSE) * 0x200 + 0x200;
  }
  *(http_parser_type *)parser = hVar2 | t & (HTTP_BOTH|HTTP_RESPONSE);
  parser->field_0x17 = parser->field_0x17 & 0x80;
  return;
}

Assistant:

void
http_parser_init (http_parser *parser, enum http_parser_type t)
{
  void *data = parser->data; /* preserve application data */
  memset(parser, 0, sizeof(*parser));
  parser->data = data;
  parser->type = t;
  parser->state = (t == HTTP_REQUEST ? s_start_req : (t == HTTP_RESPONSE ? s_start_res : s_start_req_or_res));
  parser->http_errno = HPE_OK;
}